

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.h
# Opt level: O0

void __thiscall
HighsLinearSumBounds::sumScaled(HighsLinearSumBounds *this,HighsInt sum,double scale)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ESI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  double in_XMM0_Qa;
  double in_stack_ffffffffffffffa8;
  HighsCDouble *in_stack_ffffffffffffffb0;
  
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)in_ESI);
  HighsCDouble::operator*=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 1,(long)in_ESI);
  HighsCDouble::operator*=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 4,(long)in_ESI);
  HighsCDouble::operator*=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 5,(long)in_ESI);
  HighsCDouble::operator*=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (in_XMM0_Qa < 0.0) {
    pvVar1 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (in_RDI + 4,(long)in_ESI);
    pvVar2 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (in_RDI + 5,(long)in_ESI);
    std::swap<HighsCDouble>(pvVar1,pvVar2);
    pvVar1 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (in_RDI,(long)in_ESI);
    pvVar2 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (in_RDI + 1,(long)in_ESI);
    std::swap<HighsCDouble>(pvVar1,pvVar2);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)in_ESI);
    std::swap<int>(pvVar3,pvVar4);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)in_ESI);
    std::swap<int>(pvVar3,pvVar4);
  }
  return;
}

Assistant:

void sumScaled(HighsInt sum, double scale) {
    sumLowerOrig[sum] *= scale;
    sumUpperOrig[sum] *= scale;
    sumLower[sum] *= scale;
    sumUpper[sum] *= scale;

    if (scale < 0) {
      std::swap(sumLower[sum], sumUpper[sum]);
      std::swap(sumLowerOrig[sum], sumUpperOrig[sum]);
      std::swap(numInfSumLower[sum], numInfSumUpper[sum]);
      std::swap(numInfSumLowerOrig[sum], numInfSumUpperOrig[sum]);
    }
  }